

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  CharReader *pCVar1;
  OurFeatures OVar2;
  OurFeatures features;
  bool collectComments;
  Value *in_stack_00000178;
  Value *in_stack_00000658;
  OurFeatures *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined7 uVar3;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 collectComments_00;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  Value::operator[]((Value *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  OVar2 = OurFeatures::all();
  uVar3 = OVar2._0_7_;
  collectComments_00 = OVar2._7_1_;
  iVar4 = OVar2.stackLimit_;
  Value::operator[](OVar2._0_8_,&in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asInt(in_stack_00000658);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  Value::operator[]((Value *)CONCAT17(collectComments_00,uVar3),
                    &in_stack_ffffffffffffffd0->allowComments_);
  Value::asBool(in_stack_00000178);
  pCVar1 = (CharReader *)operator_new(0x130);
  OurCharReader::OurCharReader
            ((OurCharReader *)CONCAT44(in_stack_ffffffffffffffe4,iVar4),(bool)collectComments_00,
             in_stack_ffffffffffffffd0);
  return pCVar1;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  return new OurCharReader(collectComments, features);
}